

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> * __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>::
ConvertToNonSharedSimpleDictionaryType
          (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *this,
          DynamicObject *instance)

{
  int *piVar1;
  SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false> *pSVar2;
  
  if ((this->field_0x28 & 2) == 0) {
    pSVar2 = (SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false> *)
             SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false>::
             ConvertToTypeHandler<Js::SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false>,Js::PropertyRecord_const*>
                       ((SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false> *)this
                        ,instance);
  }
  else {
    pSVar2 = SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false>::
             ConvertToSimpleDictionaryUnorderedTypeHandler<int,Js::PropertyRecord_const*,false>
                       ((SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false> *)this
                        ,instance);
  }
  piVar1 = &((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr)->
            convertSimpleSharedDictionaryToNonSharedCount;
  *piVar1 = *piVar1 + 1;
  return &pSVar2->super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>;
}

Assistant:

SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>* SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::ConvertToNonSharedSimpleDictionaryType(DynamicObject* instance)
    {
        // Although an unordered type handler is never actually shared, it can be flagged as shared by type snapshot enumeration
        // to freeze the initial type handler before enumeration commences
        SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>* newTypeHandler =
            isUnordered
                ? ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, TMapKey, IsNotExtensibleSupported>(instance)
                : ConvertToTypeHandler<SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>, TMapKey>(instance);

#ifdef PROFILE_TYPES
        instance->GetScriptContext()->convertSimpleSharedDictionaryToNonSharedCount++;
#endif
        return newTypeHandler;
    }